

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O2

void secp256k1_modinv64_update_de_62
               (secp256k1_modinv64_signed62 *d,secp256k1_modinv64_signed62 *e,
               secp256k1_modinv64_trans2x2 *t,secp256k1_modinv64_modinfo *modinfo)

{
  long lVar1;
  long lVar2;
  ulong v;
  ulong v_00;
  ulong v_01;
  secp256k1_modinv64_signed62 *a;
  int iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  undefined8 uVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  secp256k1_int128 cd;
  secp256k1_modinv64_signed62 *local_90;
  int64_t local_88;
  long local_80;
  int64_t local_78;
  int64_t local_70;
  int64_t local_68;
  int64_t local_60;
  int64_t local_58;
  int64_t local_50;
  secp256k1_int128 ce;
  
  lVar1 = d->v[0];
  local_78 = d->v[1];
  local_68 = d->v[2];
  local_58 = d->v[3];
  lVar2 = d->v[4];
  iVar6 = e->v[0];
  local_70 = e->v[1];
  local_60 = e->v[2];
  local_50 = e->v[3];
  uVar11 = t->u;
  v = t->v;
  v_00 = t->q;
  v_01 = t->r;
  local_88 = e->v[4];
  iVar3 = secp256k1_modinv64_mul_cmp_62(d,5,&secp256k1_const_modinfo_fe.modulus,-2);
  if (iVar3 < 1) {
    pcVar9 = "test condition failed: secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0"
    ;
    uVar7 = 0x1a2;
  }
  else {
    iVar3 = secp256k1_modinv64_mul_cmp_62(d,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (iVar3 < 0) {
      iVar3 = secp256k1_modinv64_mul_cmp_62(e,5,&secp256k1_const_modinfo_fe.modulus,-2);
      if (iVar3 < 1) {
        pcVar9 = 
        "test condition failed: secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0";
        uVar7 = 0x1a4;
      }
      else {
        iVar3 = secp256k1_modinv64_mul_cmp_62(e,5,&secp256k1_const_modinfo_fe.modulus,1);
        if (iVar3 < 0) {
          iVar4 = secp256k1_modinv64_abs(uVar11);
          iVar5 = secp256k1_modinv64_abs(v);
          if (0x4000000000000000 - iVar5 < iVar4) {
            pcVar9 = 
            "test condition failed: secp256k1_modinv64_abs(u) <= (((int64_t)1 << 62) - secp256k1_modinv64_abs(v))"
            ;
            uVar7 = 0x1a6;
          }
          else {
            iVar4 = secp256k1_modinv64_abs(v_00);
            iVar5 = secp256k1_modinv64_abs(v_01);
            if (0x4000000000000000 - iVar5 < iVar4) {
              pcVar9 = 
              "test condition failed: secp256k1_modinv64_abs(q) <= (((int64_t)1 << 62) - secp256k1_modinv64_abs(r))"
              ;
              uVar7 = 0x1a7;
            }
            else {
              uVar8 = lVar2 >> 0x3f;
              lVar10 = (v & local_88 >> 0x3f) + (uVar11 & uVar8);
              lVar12 = (local_88 >> 0x3f & v_01) + (uVar8 & v_00);
              cd._0_8_ = uVar11 * lVar1;
              cd._8_8_ = SUB168(SEXT816((long)uVar11) * SEXT816(lVar1),8);
              local_90 = e;
              local_80 = lVar2;
              secp256k1_i128_accum_mul(&cd,v,iVar6);
              ce._0_8_ = v_00 * lVar1;
              ce._8_8_ = SUB168(SEXT816((long)v_00) * SEXT816(lVar1),8);
              secp256k1_i128_accum_mul(&ce,v_01,iVar6);
              lVar10 = lVar10 - ((ulong)cd * 0x27c7f6e22ddacacf + lVar10 & 0x3fffffffffffffff);
              lVar12 = lVar12 - ((ulong)ce * 0x27c7f6e22ddacacf + lVar12 & 0x3fffffffffffffff);
              secp256k1_i128_accum_mul(&cd,-0x1000003d1,lVar10);
              secp256k1_i128_accum_mul(&ce,-0x1000003d1,lVar12);
              iVar6 = local_78;
              if (((ulong)cd & 0x3fffffffffffffff) == 0) {
                cd._0_8_ = (ulong)cd >> 0x3e | cd._8_8_ << 2;
                cd._8_8_ = cd._8_8_ >> 0x3e;
                if (((ulong)ce & 0x3fffffffffffffff) == 0) {
                  ce._0_8_ = (ulong)ce >> 0x3e | ce._8_8_ << 2;
                  ce._8_8_ = ce._8_8_ >> 0x3e;
                  secp256k1_i128_accum_mul(&cd,uVar11,local_78);
                  iVar4 = local_70;
                  secp256k1_i128_accum_mul(&cd,v,local_70);
                  secp256k1_i128_accum_mul(&ce,v_00,iVar6);
                  secp256k1_i128_accum_mul(&ce,v_01,iVar4);
                  iVar6 = local_68;
                  d->v[0] = (ulong)cd & 0x3fffffffffffffff;
                  cd._0_8_ = (ulong)cd >> 0x3e | cd._8_8_ << 2;
                  cd._8_8_ = cd._8_8_ >> 0x3e;
                  uVar8 = (ulong)ce & 0x3fffffffffffffff;
                  ce._0_8_ = (ulong)ce >> 0x3e | ce._8_8_ << 2;
                  local_90->v[0] = uVar8;
                  ce._8_8_ = ce._8_8_ >> 0x3e;
                  secp256k1_i128_accum_mul(&cd,uVar11,local_68);
                  iVar4 = local_60;
                  secp256k1_i128_accum_mul(&cd,v,local_60);
                  secp256k1_i128_accum_mul(&ce,v_00,iVar6);
                  secp256k1_i128_accum_mul(&ce,v_01,iVar4);
                  iVar6 = local_58;
                  a = local_90;
                  d->v[1] = (ulong)cd & 0x3fffffffffffffff;
                  cd._0_8_ = (ulong)cd >> 0x3e | cd._8_8_ << 2;
                  cd._8_8_ = cd._8_8_ >> 0x3e;
                  uVar8 = (ulong)ce & 0x3fffffffffffffff;
                  ce._0_8_ = (ulong)ce >> 0x3e | ce._8_8_ << 2;
                  local_90->v[1] = uVar8;
                  ce._8_8_ = ce._8_8_ >> 0x3e;
                  secp256k1_i128_accum_mul(&cd,uVar11,local_58);
                  iVar4 = local_50;
                  secp256k1_i128_accum_mul(&cd,v,local_50);
                  secp256k1_i128_accum_mul(&ce,v_00,iVar6);
                  secp256k1_i128_accum_mul(&ce,v_01,iVar4);
                  lVar1 = local_80;
                  d->v[2] = (ulong)cd & 0x3fffffffffffffff;
                  cd._0_8_ = (ulong)cd >> 0x3e | cd._8_8_ << 2;
                  cd._8_8_ = cd._8_8_ >> 0x3e;
                  uVar8 = (ulong)ce & 0x3fffffffffffffff;
                  ce._0_8_ = (ulong)ce >> 0x3e | ce._8_8_ << 2;
                  a->v[2] = uVar8;
                  ce._8_8_ = ce._8_8_ >> 0x3e;
                  secp256k1_i128_accum_mul(&cd,uVar11,local_80);
                  iVar6 = local_88;
                  secp256k1_i128_accum_mul(&cd,v,local_88);
                  secp256k1_i128_accum_mul(&ce,v_00,lVar1);
                  secp256k1_i128_accum_mul(&ce,v_01,iVar6);
                  secp256k1_i128_accum_mul(&cd,0x100,lVar10);
                  secp256k1_i128_accum_mul(&ce,0x100,lVar12);
                  d->v[3] = (ulong)cd & 0x3fffffffffffffff;
                  cd._0_8_ = (ulong)cd >> 0x3e | cd._8_8_ << 2;
                  cd._8_8_ = cd._8_8_ >> 0x3e;
                  uVar11 = (ulong)ce & 0x3fffffffffffffff;
                  ce._0_8_ = (ulong)ce >> 0x3e | ce._8_8_ << 2;
                  a->v[3] = uVar11;
                  ce._8_8_ = ce._8_8_ >> 0x3e;
                  iVar6 = secp256k1_i128_to_i64(&cd);
                  d->v[4] = iVar6;
                  iVar6 = secp256k1_i128_to_i64(&ce);
                  a->v[4] = iVar6;
                  iVar3 = secp256k1_modinv64_mul_cmp_62(d,5,&secp256k1_const_modinfo_fe.modulus,-2);
                  if (iVar3 < 1) {
                    pcVar9 = 
                    "test condition failed: secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0"
                    ;
                    uVar7 = 0x1ea;
                  }
                  else {
                    iVar3 = secp256k1_modinv64_mul_cmp_62(d,5,&secp256k1_const_modinfo_fe.modulus,1)
                    ;
                    if (iVar3 < 0) {
                      iVar3 = secp256k1_modinv64_mul_cmp_62
                                        (a,5,&secp256k1_const_modinfo_fe.modulus,-2);
                      if (iVar3 < 1) {
                        pcVar9 = 
                        "test condition failed: secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0"
                        ;
                        uVar7 = 0x1ec;
                      }
                      else {
                        iVar3 = secp256k1_modinv64_mul_cmp_62
                                          (a,5,&secp256k1_const_modinfo_fe.modulus,1);
                        if (iVar3 < 0) {
                          return;
                        }
                        pcVar9 = 
                        "test condition failed: secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0"
                        ;
                        uVar7 = 0x1ed;
                      }
                    }
                    else {
                      pcVar9 = 
                      "test condition failed: secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0"
                      ;
                      uVar7 = 0x1eb;
                    }
                  }
                }
                else {
                  pcVar9 = "test condition failed: (secp256k1_i128_to_u64(&ce) & M62) == 0";
                  uVar7 = 0x1bb;
                }
              }
              else {
                pcVar9 = "test condition failed: (secp256k1_i128_to_u64(&cd) & M62) == 0";
                uVar7 = 0x1ba;
              }
            }
          }
        }
        else {
          pcVar9 = 
          "test condition failed: secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0";
          uVar7 = 0x1a5;
        }
      }
    }
    else {
      pcVar9 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0";
      uVar7 = 0x1a3;
    }
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modinv64_impl.h"
          ,uVar7,pcVar9);
  abort();
}

Assistant:

static void secp256k1_modinv64_update_de_62(secp256k1_modinv64_signed62 *d, secp256k1_modinv64_signed62 *e, const secp256k1_modinv64_trans2x2 *t, const secp256k1_modinv64_modinfo* modinfo) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const int64_t d0 = d->v[0], d1 = d->v[1], d2 = d->v[2], d3 = d->v[3], d4 = d->v[4];
    const int64_t e0 = e->v[0], e1 = e->v[1], e2 = e->v[2], e3 = e->v[3], e4 = e->v[4];
    const int64_t u = t->u, v = t->v, q = t->q, r = t->r;
    int64_t md, me, sd, se;
    secp256k1_int128 cd, ce;
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0);  /* e <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_abs(u) <= (((int64_t)1 << 62) - secp256k1_modinv64_abs(v))); /* |u|+|v| <= 2^62 */
    VERIFY_CHECK(secp256k1_modinv64_abs(q) <= (((int64_t)1 << 62) - secp256k1_modinv64_abs(r))); /* |q|+|r| <= 2^62 */

    /* [md,me] start as zero; plus [u,q] if d is negative; plus [v,r] if e is negative. */
    sd = d4 >> 63;
    se = e4 >> 63;
    md = (u & sd) + (v & se);
    me = (q & sd) + (r & se);
    /* Begin computing t*[d,e]. */
    secp256k1_i128_mul(&cd, u, d0);
    secp256k1_i128_accum_mul(&cd, v, e0);
    secp256k1_i128_mul(&ce, q, d0);
    secp256k1_i128_accum_mul(&ce, r, e0);
    /* Correct md,me so that t*[d,e]+modulus*[md,me] has 62 zero bottom bits. */
    md -= (modinfo->modulus_inv62 * secp256k1_i128_to_u64(&cd) + md) & M62;
    me -= (modinfo->modulus_inv62 * secp256k1_i128_to_u64(&ce) + me) & M62;
    /* Update the beginning of computation for t*[d,e]+modulus*[md,me] now md,me are known. */
    secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[0], md);
    secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[0], me);
    /* Verify that the low 62 bits of the computation are indeed zero, and then throw them away. */
    VERIFY_CHECK((secp256k1_i128_to_u64(&cd) & M62) == 0); secp256k1_i128_rshift(&cd, 62);
    VERIFY_CHECK((secp256k1_i128_to_u64(&ce) & M62) == 0); secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 1 of t*[d,e]+modulus*[md,me], and store it as output limb 0 (= down shift). */
    secp256k1_i128_accum_mul(&cd, u, d1);
    secp256k1_i128_accum_mul(&cd, v, e1);
    secp256k1_i128_accum_mul(&ce, q, d1);
    secp256k1_i128_accum_mul(&ce, r, e1);
    if (modinfo->modulus.v[1]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[1], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[1], me);
    }
    d->v[0] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[0] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 2 of t*[d,e]+modulus*[md,me], and store it as output limb 1. */
    secp256k1_i128_accum_mul(&cd, u, d2);
    secp256k1_i128_accum_mul(&cd, v, e2);
    secp256k1_i128_accum_mul(&ce, q, d2);
    secp256k1_i128_accum_mul(&ce, r, e2);
    if (modinfo->modulus.v[2]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[2], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[2], me);
    }
    d->v[1] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[1] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 3 of t*[d,e]+modulus*[md,me], and store it as output limb 2. */
    secp256k1_i128_accum_mul(&cd, u, d3);
    secp256k1_i128_accum_mul(&cd, v, e3);
    secp256k1_i128_accum_mul(&ce, q, d3);
    secp256k1_i128_accum_mul(&ce, r, e3);
    if (modinfo->modulus.v[3]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[3], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[3], me);
    }
    d->v[2] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[2] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 4 of t*[d,e]+modulus*[md,me], and store it as output limb 3. */
    secp256k1_i128_accum_mul(&cd, u, d4);
    secp256k1_i128_accum_mul(&cd, v, e4);
    secp256k1_i128_accum_mul(&ce, q, d4);
    secp256k1_i128_accum_mul(&ce, r, e4);
    secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[4], md);
    secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[4], me);
    d->v[3] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[3] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* What remains is limb 5 of t*[d,e]+modulus*[md,me]; store it as output limb 4. */
    d->v[4] = secp256k1_i128_to_i64(&cd);
    e->v[4] = secp256k1_i128_to_i64(&ce);

    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0);  /* e <    modulus */
}